

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O3

void diy::
     reduce<diy::detail::KDTreePartition<BlockT,PointT>,diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,KDTreePartners *partners,
               KDTreePartition<BlockT,_PointT> *reduce,ReduceNeverSkip *skip)

{
  offset_in_BlockT_to_vector<PointT,_std::allocator<PointT>_> oVar1;
  bool bVar2;
  mapped_type *this;
  mapped_type *this_00;
  int round_;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> incoming_gids;
  _Any_data local_3a0;
  code *local_390;
  code *local_388;
  int local_37c;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_358;
  KDTreePartition<BlockT,_PointT> *local_350;
  Assigner *local_348;
  ulong local_340;
  int *local_338;
  IncomingRoundMap *local_330;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  _Any_data local_308;
  code *local_2f8;
  code *local_2f0;
  _Any_data local_2e8;
  code *local_2d8;
  code *local_2d0;
  ReductionFunctor<BlockT,_diy::detail::KDTreePartners> local_2c8;
  
  local_350 = reduce;
  local_348 = assigner;
  local_358 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_358->_M_use_count = 1;
  local_358->_M_weak_count = 1;
  local_358->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014f430;
  local_37c = master->expected_;
  if ((partners->rounds_).
      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (partners->rounds_).
      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
  }
  else {
    local_330 = &master->incoming_;
    local_338 = &master->exchange_round_;
    uVar4 = 0;
    do {
      local_3a0._8_8_ = 0;
      local_3a0._M_unused._M_object = operator_new(0x18);
      *(size_t *)((long)local_3a0._M_unused._0_8_ + 0x10) = local_350->bins_;
      oVar1 = local_350->points_;
      *(undefined8 *)local_3a0._M_unused._0_8_ = *(undefined8 *)local_350;
      *(offset_in_BlockT_to_vector<PointT,_std::allocator<PointT>_> *)
       ((long)local_3a0._M_unused._0_8_ + 8) = oVar1;
      local_388 = std::
                  _Function_handler<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&),_diy::detail::KDTreePartition<BlockT,_PointT>_>
                  ::_M_invoke;
      local_390 = std::
                  _Function_handler<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&),_diy::detail::KDTreePartition<BlockT,_PointT>_>
                  ::_M_manager;
      round_ = (int)uVar4;
      detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::ReductionFunctor
                (&local_2c8,round_,(Callback *)&local_3a0,partners,local_348);
      local_378._8_8_ = 0;
      local_378._M_unused._M_object = operator_new(0x18);
      *(int *)local_378._M_unused._0_8_ = round_;
      *(KDTreePartners **)((long)local_378._M_unused._0_8_ + 8) = partners;
      local_360 = std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>_>
                  ::_M_invoke;
      local_368 = std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>_>
                  ::_M_manager;
      Master::foreach<diy::detail::ReductionFunctor<BlockT,diy::detail::KDTreePartners>>
                (master,&local_2c8,(Skip *)&local_378);
      if (local_368 != (code *)0x0) {
        (*local_368)(&local_378,&local_378,__destroy_functor);
      }
      detail::KDTreePartners::~KDTreePartners(&local_2c8.partners);
      if (local_2c8.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_2c8.reduce.super__Function_base._M_manager)
                  ((_Any_data *)&local_2c8.reduce,(_Any_data *)&local_2c8.reduce,__destroy_functor);
      }
      if (local_390 != (code *)0x0) {
        (*local_390)(&local_3a0,&local_3a0,__destroy_functor);
      }
      Master::execute(master);
      local_340 = uVar4;
      if ((int)((ulong)((long)(master->blocks_).elements_.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) == 0) {
        iVar5 = 0;
      }
      else {
        uVar3 = 0;
        iVar5 = 0;
        do {
          bVar2 = detail::KDTreePartners::active
                            (partners,round_ + 1,
                             (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar3],master);
          if (bVar2) {
            local_2c8._0_8_ = (pointer)0x0;
            local_2c8.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
            local_2c8.reduce.super__Function_base._M_functor._8_8_ = 0;
            detail::KDTreePartners::incoming
                      (partners,round_ + 1,
                       (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar3],
                       (vector<int,_std::allocator<int>_> *)&local_2c8,master);
            uVar4 = (long)local_2c8.reduce.super__Function_base._M_functor._M_unused._0_8_ -
                    local_2c8._0_8_;
            local_3a0._0_4_ =
                 (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar3];
            this = std::
                   map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                   ::operator[](local_330,local_338);
            this_00 = std::
                      map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                      ::operator[](&this->map,(key_type *)local_3a0._M_pod_data);
            concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
            ::clear(this_00);
            if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2c8._0_8_,
                              local_2c8.reduce.super__Function_base._M_functor._8_8_ -
                              local_2c8._0_8_);
            }
            iVar5 = iVar5 + (int)(uVar4 >> 2);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < (uint)((ulong)((long)(master->blocks_).elements_.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(master->blocks_).elements_.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      master->expected_ = iVar5;
      local_328._M_unused._M_object = (void *)0x0;
      local_328._8_8_ = 0;
      local_310 = std::
                  _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                  ::_M_invoke;
      local_318 = std::
                  _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                  ::_M_manager;
      local_308._M_unused._M_object = (void *)0x0;
      local_308._8_8_ = 0;
      local_2f0 = std::
                  _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                  ::_M_invoke;
      local_2f8 = std::
                  _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                  ::_M_manager;
      local_2e8._M_unused._M_object = (void *)0x0;
      local_2e8._8_8_ = 0;
      local_2d0 = std::
                  _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                  ::_M_invoke;
      local_2d8 = std::
                  _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                  ::_M_manager;
      Master::flush(master,false,(MemoryManagement *)&local_328);
      uVar4 = local_340;
      if (local_2d8 != (code *)0x0) {
        (*local_2d8)(&local_2e8,&local_2e8,__destroy_functor);
      }
      if (local_2f8 != (code *)0x0) {
        (*local_2f8)(&local_308,&local_308,__destroy_functor);
      }
      if (local_318 != (code *)0x0) {
        (*local_318)(&local_328,&local_328,__destroy_functor);
      }
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar4 < (ulong)((long)(partners->rounds_).
                                   super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(partners->rounds_).
                                   super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_3a0._8_8_ = 0;
  local_3a0._M_unused._M_object = operator_new(0x18);
  *(size_t *)((long)local_3a0._M_unused._0_8_ + 0x10) = local_350->bins_;
  oVar1 = local_350->points_;
  *(undefined8 *)local_3a0._M_unused._0_8_ = *(undefined8 *)local_350;
  *(offset_in_BlockT_to_vector<PointT,_std::allocator<PointT>_> *)
   ((long)local_3a0._M_unused._0_8_ + 8) = oVar1;
  local_388 = std::
              _Function_handler<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&),_diy::detail::KDTreePartition<BlockT,_PointT>_>
              ::_M_invoke;
  local_390 = std::
              _Function_handler<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&),_diy::detail::KDTreePartition<BlockT,_PointT>_>
              ::_M_manager;
  detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::ReductionFunctor
            (&local_2c8,uVar3,(Callback *)&local_3a0,partners,local_348);
  local_378._8_8_ = 0;
  local_378._M_unused._M_object = operator_new(0x18);
  *(uint *)local_378._M_unused._0_8_ = uVar3;
  *(KDTreePartners **)((long)local_378._M_unused._0_8_ + 8) = partners;
  local_360 = std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>_>
              ::_M_invoke;
  local_368 = std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>_>
              ::_M_manager;
  Master::foreach<diy::detail::ReductionFunctor<BlockT,diy::detail::KDTreePartners>>
            (master,&local_2c8,(Skip *)&local_378);
  if (local_368 != (code *)0x0) {
    (*local_368)(&local_378,&local_378,__destroy_functor);
  }
  detail::KDTreePartners::~KDTreePartners(&local_2c8.partners);
  if (local_2c8.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2c8.reduce.super__Function_base._M_manager)
              ((_Any_data *)&local_2c8.reduce,(_Any_data *)&local_2c8.reduce,__destroy_functor);
  }
  if (local_390 != (code *)0x0) {
    (*local_390)(&local_3a0,&local_3a0,__destroy_functor);
  }
  master->expected_ = local_37c;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}